

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_tests.hpp
# Opt level: O2

void __thiscall TestLogger::voutput(TestLogger *this,char *fmt,__va_list_tag *va)

{
  va_list va2;
  char buf [4096];
  undefined8 local_1048;
  void *pvStack_1040;
  void *local_1038;
  char local_1028 [4104];
  
  memset(local_1028,0,0x1000);
  local_1038 = va->reg_save_area;
  local_1048._0_4_ = va->gp_offset;
  local_1048._4_4_ = va->fp_offset;
  pvStack_1040 = va->overflow_arg_area;
  vsprintf(local_1028,fmt,&local_1048);
  std::__cxx11::string::append((char *)&this->m_log);
  vprintf(fmt,va);
  return;
}

Assistant:

IUTEST_CXX_OVERRIDE IUTEST_ATTRIBUTE_FORMAT_PRINTF(2, 0)
    {
IUTEST_PRAGMA_CRT_SECURE_WARN_DISABLE_BEGIN()
        char buf[4096] = { 0 };
        va_list va2;
        iu_va_copy(va2, va);
        vsprintf(buf, fmt, va2);
        va_end(va2);
        m_log += buf;
        ::iutest::detail::iuConsole::nl_voutput(fmt, va);
IUTEST_PRAGMA_CRT_SECURE_WARN_DISABLE_END()
    }